

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesBoolWidget.cxx
# Opt level: O2

void __thiscall
cmCursesBoolWidget::cmCursesBoolWidget
          (cmCursesBoolWidget *this,int width,int height,int left,int top)

{
  cmCursesWidget::cmCursesWidget(&this->super_cmCursesWidget,width,height,left,top);
  (this->super_cmCursesWidget)._vptr_cmCursesWidget = (_func_int **)&PTR__cmCursesWidget_00527e40;
  (this->super_cmCursesWidget).Type = BOOL;
  set_field_fore((this->super_cmCursesWidget).Field,0);
  set_field_back((this->super_cmCursesWidget).Field,0x10000);
  field_opts_off((this->super_cmCursesWidget).Field,0x200);
  SetValueAsBool(this,false);
  return;
}

Assistant:

cmCursesBoolWidget::cmCursesBoolWidget(int width, int height, int left,
                                       int top)
  : cmCursesWidget(width, height, left, top)
{
  this->Type = cmStateEnums::BOOL;
  set_field_fore(this->Field, A_NORMAL);
  set_field_back(this->Field, A_STANDOUT);
  field_opts_off(this->Field, O_STATIC);
  this->SetValueAsBool(false);
}